

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

string * __thiscall
toml::detail::show_char_abi_cxx11_(string *__return_storage_ptr__,detail *this,char c)

{
  int iVar1;
  allocator<char> local_21;
  array<char,_5UL> buf;
  
  iVar1 = isgraph((int)((ulong)this & 0xff));
  if (iVar1 == 0) {
    buf._M_elems[4] = '\0';
    buf._M_elems[0] = '\0';
    buf._M_elems[1] = '\0';
    buf._M_elems[2] = '\0';
    buf._M_elems[3] = '\0';
    iVar1 = snprintf(buf._M_elems,5,"0x%02x",(ulong)this & 0xff);
    if (iVar1 != 4) {
      __assert_fail("r == static_cast<int>(buf.size()) - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/combinator.hpp"
                    ,0x33,"std::string toml::detail::show_char(const char)");
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,buf._M_elems,&local_21);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string show_char(const char c)
{
    // It suppresses an error that occurs only in Debug mode of MSVC++ on Windows.
    // I'm not completely sure but they check the value of char to be in the
    // range [0, 256) and some of the COMPLETELY VALID utf-8 character sometimes
    // has negative value (if char has sign). So here it re-interprets c as
    // unsigned char through pointer. In general, converting pointer to a
    // pointer that has different type cause UB, but `(signed|unsigned)?char`
    // are one of the exceptions. Converting pointer only to char and std::byte
    // (c++17) are valid.
    if(std::isgraph(*reinterpret_cast<unsigned char const*>(std::addressof(c))))
    {
        return std::string(1, c);
    }
    else
    {
        std::array<char, 5> buf;
        buf.fill('\0');
        const auto r = std::snprintf(
                buf.data(), buf.size(), "0x%02x", static_cast<int>(c) & 0xFF);
        (void) r; // Unused variable warning
        assert(r == static_cast<int>(buf.size()) - 1);
        return std::string(buf.data());
    }
}